

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgList<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::_load_cimg
          (CImgList<unsigned_char> *this,FILE *file,char *filename)

{
  uint uVar1;
  uint uVar2;
  CImg<unsigned_char> *pCVar3;
  undefined8 uVar4;
  int iVar5;
  CImgArgumentException *this_00;
  char *pcVar6;
  CImgIOException *pCVar7;
  type_conflict3 tVar8;
  unsigned_long uVar9;
  bool bVar10;
  bool bVar11;
  undefined4 uVar13;
  int *piVar12;
  undefined8 in_stack_fffffffffffff180;
  undefined4 uVar14;
  char *local_e50;
  char *local_e00;
  char *local_dd8;
  char *local_d78;
  char *local_d50;
  char *local_ce8;
  char *local_cc0;
  char *local_c60;
  char *local_c38;
  char *local_bd8;
  char *local_bb0;
  char *local_b50;
  char *local_b28;
  char *local_ac8;
  char *local_aa0;
  char *local_a40;
  char *local_a18;
  char *local_9b0;
  char *local_988;
  char *local_928;
  char *local_900;
  char *local_8a0;
  char *local_878;
  char *local_818;
  char *local_7f0;
  char *local_790;
  char *local_768;
  char *local_708;
  char *local_6e0;
  char *local_678;
  char *local_650;
  char *local_600;
  bool local_5d7;
  FILE *local_5c8;
  ulong local_598;
  unsigned_long off_14;
  double *ptrs_14;
  unsigned_long to_read_14;
  uchar *ptrd_14;
  CImg<unsigned_char> *img_14;
  CImg<double> raw_14;
  ulong uStack_548;
  uint l_14;
  unsigned_long off_13;
  float *ptrs_13;
  unsigned_long to_read_13;
  uchar *ptrd_13;
  CImg<unsigned_char> *img_13;
  CImg<float> raw_13;
  ulong uStack_4f8;
  uint l_13;
  unsigned_long off_12;
  long *ptrs_12;
  unsigned_long to_read_12;
  uchar *ptrd_12;
  CImg<unsigned_char> *img_12;
  CImg<long> raw_12;
  ulong uStack_4a8;
  uint l_12;
  unsigned_long off_11;
  unsigned_long *ptrs_11;
  unsigned_long to_read_11;
  uchar *ptrd_11;
  CImg<unsigned_char> *img_11;
  CImg<unsigned_long> raw_11;
  ulong uStack_458;
  uint l_11;
  unsigned_long off_10;
  unsigned_long *ptrs_10;
  unsigned_long to_read_10;
  uchar *ptrd_10;
  CImg<unsigned_char> *img_10;
  CImg<unsigned_long> raw_10;
  ulong uStack_408;
  uint l_10;
  unsigned_long off_9;
  int *ptrs_9;
  unsigned_long to_read_9;
  uchar *ptrd_9;
  CImg<unsigned_char> *img_9;
  CImg<int> raw_9;
  ulong uStack_3b8;
  uint l_9;
  unsigned_long off_8;
  uint *ptrs_8;
  unsigned_long to_read_8;
  uchar *ptrd_8;
  CImg<unsigned_char> *img_8;
  CImg<unsigned_int> raw_8;
  ulong uStack_368;
  uint l_8;
  unsigned_long off_7;
  uint *ptrs_7;
  unsigned_long to_read_7;
  uchar *ptrd_7;
  CImg<unsigned_char> *img_7;
  CImg<unsigned_int> raw_7;
  ulong uStack_318;
  uint l_7;
  unsigned_long off_6;
  short *ptrs_6;
  unsigned_long to_read_6;
  uchar *ptrd_6;
  CImg<unsigned_char> *img_6;
  CImg<short> raw_6;
  ulong uStack_2c8;
  uint l_6;
  unsigned_long off_5;
  unsigned_short *ptrs_5;
  unsigned_long to_read_5;
  uchar *ptrd_5;
  CImg<unsigned_char> *img_5;
  CImg<unsigned_short> raw_5;
  ulong uStack_278;
  uint l_5;
  unsigned_long off_4;
  unsigned_short *ptrs_4;
  unsigned_long to_read_4;
  uchar *ptrd_4;
  CImg<unsigned_char> *img_4;
  CImg<unsigned_short> raw_4;
  ulong uStack_228;
  uint l_4;
  unsigned_long off_3;
  char *ptrs_3;
  unsigned_long to_read_3;
  uchar *ptrd_3;
  CImg<unsigned_char> *img_3;
  CImg<char> raw_3;
  ulong uStack_1d8;
  uint l_3;
  unsigned_long off_2;
  uchar *ptrs_2;
  unsigned_long to_read_2;
  uchar *ptrd_2;
  CImg<unsigned_char> *img_2;
  CImg<unsigned_char> raw_2;
  ulong uStack_188;
  uint l_2;
  unsigned_long off_1;
  uchar *ptrs_1;
  unsigned_long to_read_1;
  uchar *ptrd_1;
  CImg<unsigned_char> *img_1;
  CImg<unsigned_char> raw_1;
  ulong uStack_138;
  uint l_1;
  unsigned_long off;
  bool *ptrs;
  unsigned_long to_read;
  uchar *ptrd;
  CImg<unsigned_char> *img;
  CImg<bool> raw;
  uint l;
  int err;
  int i;
  unsigned_long csiz;
  uint C;
  uint D;
  uint H;
  uint W;
  uint N;
  uint j;
  CImg<char> str_endian;
  CImg<char> str_pixeltype;
  CImg<char> tmp;
  bool endian;
  bool loaded;
  FILE *nfile;
  unsigned_long cimg_iobuffer;
  char *local_38;
  char *filename_local;
  FILE *file_local;
  CImgList<unsigned_char> *this_local;
  
  local_38 = filename;
  filename_local = (char *)file;
  file_local = (FILE *)this;
  if ((filename == (char *)0x0) && (file == (FILE *)0x0)) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_allocated_width;
    pCVar3 = this->_data;
    pcVar6 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Specified filename is (null).",
               (ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  nfile = (FILE *)0x1800000;
  local_5c8 = (FILE *)file;
  if (file == (FILE *)0x0) {
    local_5c8 = cimg::fopen(filename,"rb");
  }
  bVar11 = false;
  tmp._data._6_1_ = cimg::endianness();
  CImg<char>::CImg((CImg<char> *)&str_pixeltype._data,0x100,1,1,1);
  CImg<char>::CImg((CImg<char> *)&str_endian._data,0x100,1,1,1);
  CImg<char>::CImg((CImg<char> *)&N,0x100,1,1,1);
  pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&N);
  *pcVar6 = '\0';
  pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_endian._data);
  *pcVar6 = '\0';
  pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
  *pcVar6 = '\0';
  H = 0;
  do {
    W = 0;
    while( true ) {
      iVar5 = fgetc(local_5c8);
      bVar10 = false;
      if ((iVar5 != 10) && (bVar10 = false, -1 < iVar5)) {
        bVar10 = W < 0xff;
      }
      if (!bVar10) break;
      pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
      pcVar6[W] = (char)iVar5;
      W = W + 1;
    }
    pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
    pcVar6[W] = '\0';
    pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
    local_5d7 = *pcVar6 == '#' && -1 < iVar5;
  } while (local_5d7);
  pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
  iVar5 = __isoc99_sscanf(pcVar6,"%u%*c%255[A-Za-z_]%*c%255[sA-Za-z_ ]",&H,str_pixeltype._16_8_,
                          str_endian._16_8_);
  if (1 < iVar5) {
    pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&N);
    iVar5 = cimg::strncasecmp("little",pcVar6,6);
    if (iVar5 == 0) {
      tmp._data._6_1_ = false;
    }
    else {
      pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&N);
      iVar5 = cimg::strncasecmp("big",pcVar6,3);
      if (iVar5 == 0) {
        tmp._data._6_1_ = true;
      }
    }
    assign(this,H);
    pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_endian._data);
    iVar5 = cimg::strcasecmp("bool",pcVar6);
    if (iVar5 == 0) {
      for (raw._data._4_4_ = 0; raw._data._4_4_ < H; raw._data._4_4_ = raw._data._4_4_ + 1) {
        W = 0;
        while( true ) {
          iVar5 = fgetc(local_5c8);
          bVar11 = false;
          if ((iVar5 != 10) && (bVar11 = false, -1 < iVar5)) {
            bVar11 = W < 0xff;
          }
          if (!bVar11) break;
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          pcVar6[W] = (char)iVar5;
          W = W + 1;
        }
        pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
        pcVar6[W] = '\0';
        csiz._0_4_ = 0;
        csiz._4_4_ = 0;
        C = 0;
        D = 0;
        _err = 0;
        pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
        piVar12 = &err;
        iVar5 = __isoc99_sscanf(pcVar6,"%u %u %u %u #%lu",&D,&C,(long)&csiz + 4,&csiz,piVar12);
        uVar13 = (undefined4)((ulong)piVar12 >> 0x20);
        uVar14 = (undefined4)((ulong)in_stack_fffffffffffff180 >> 0x20);
        if (iVar5 < 4) {
          pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
          uVar1 = this->_width;
          uVar2 = this->_allocated_width;
          pCVar3 = this->_data;
          pcVar6 = pixel_type();
          if (local_38 == (char *)0x0) {
            local_650 = "(FILE*)";
          }
          else {
            local_650 = local_38;
          }
          CImgIOException::CImgIOException
                    (pCVar7,
                     "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                     ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,CONCAT44(uVar13,D),CONCAT44(uVar14,C),
                     csiz._4_4_,(uint)csiz,raw._data._4_4_,local_650);
          __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
        }
        if (D * C * csiz._4_4_ * (uint)csiz != 0) {
          CImg<bool>::CImg((CImg<bool> *)&img);
          ptrd = (uchar *)(this->_data + raw._data._4_4_);
          if (iVar5 == 5) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            uVar1 = this->_width;
            uVar2 = this->_allocated_width;
            pCVar3 = this->_data;
            pcVar6 = pixel_type();
            if (local_38 == (char *)0x0) {
              local_678 = "(FILE*)";
            }
            else {
              local_678 = local_38;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                       ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,local_678);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
          }
          CImg<unsigned_char>::assign((CImg<unsigned_char> *)ptrd,D,C,csiz._4_4_,(uint)csiz);
          to_read = *(unsigned_long *)(ptrd + 0x18);
          for (ptrs = (bool *)CImg<unsigned_char>::size((CImg<unsigned_char> *)ptrd);
              ptrs != (bool *)0x0; ptrs = ptrs + -(ulong)(uint)img) {
            tVar8 = cimg::min<unsigned_long,unsigned_long>
                              ((unsigned_long *)&ptrs,(unsigned_long *)&nfile);
            CImg<bool>::assign((CImg<bool> *)&img,(uint)tVar8,1,1,1);
            cimg::fread<bool>((bool *)raw._16_8_,(ulong)(uint)img,(FILE *)local_5c8);
            bVar11 = cimg::endianness();
            uVar4 = raw._16_8_;
            if (tmp._data._6_1_ != bVar11) {
              uVar9 = CImg<bool>::size((CImg<bool> *)&img);
              cimg::invert_endianness<bool>((bool *)uVar4,uVar9);
            }
            off = raw._16_8_;
            for (uStack_138 = (ulong)(uint)img; uStack_138 != 0; uStack_138 = uStack_138 - 1) {
              *(byte *)to_read = *(byte *)off & 1;
              off = off + 1;
              to_read = to_read + 1;
            }
          }
          CImg<bool>::~CImg((CImg<bool> *)&img);
        }
      }
      bVar11 = true;
    }
    if (!bVar11) {
      pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_endian._data);
      iVar5 = cimg::strcasecmp("unsigned_char",pcVar6);
      if (iVar5 == 0) {
        for (raw_1._data._4_4_ = 0; raw_1._data._4_4_ < H; raw_1._data._4_4_ = raw_1._data._4_4_ + 1
            ) {
          W = 0;
          while( true ) {
            iVar5 = fgetc(local_5c8);
            bVar11 = false;
            if ((iVar5 != 10) && (bVar11 = false, -1 < iVar5)) {
              bVar11 = W < 0xff;
            }
            if (!bVar11) break;
            pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
            pcVar6[W] = (char)iVar5;
            W = W + 1;
          }
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          pcVar6[W] = '\0';
          csiz._0_4_ = 0;
          csiz._4_4_ = 0;
          C = 0;
          D = 0;
          _err = 0;
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          piVar12 = &err;
          iVar5 = __isoc99_sscanf(pcVar6,"%u %u %u %u #%lu",&D,&C,(long)&csiz + 4,&csiz,piVar12);
          uVar13 = (undefined4)((ulong)piVar12 >> 0x20);
          uVar14 = (undefined4)((ulong)in_stack_fffffffffffff180 >> 0x20);
          if (iVar5 < 4) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            uVar1 = this->_width;
            uVar2 = this->_allocated_width;
            pCVar3 = this->_data;
            pcVar6 = pixel_type();
            if (local_38 == (char *)0x0) {
              local_6e0 = "(FILE*)";
            }
            else {
              local_6e0 = local_38;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                       ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,CONCAT44(uVar13,D),
                       CONCAT44(uVar14,C),csiz._4_4_,(uint)csiz,raw_1._data._4_4_,local_6e0);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
          }
          if (D * C * csiz._4_4_ * (uint)csiz != 0) {
            CImg<unsigned_char>::CImg((CImg<unsigned_char> *)&img_1);
            ptrd_1 = (uchar *)(this->_data + raw_1._data._4_4_);
            if (iVar5 == 5) {
              pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
              uVar1 = this->_width;
              uVar2 = this->_allocated_width;
              pCVar3 = this->_data;
              pcVar6 = pixel_type();
              if (local_38 == (char *)0x0) {
                local_708 = "(FILE*)";
              }
              else {
                local_708 = local_38;
              }
              CImgIOException::CImgIOException
                        (pCVar7,
                         "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                         ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,local_708);
              __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
            }
            CImg<unsigned_char>::assign((CImg<unsigned_char> *)ptrd_1,D,C,csiz._4_4_,(uint)csiz);
            to_read_1 = *(unsigned_long *)(ptrd_1 + 0x18);
            for (ptrs_1 = (uchar *)CImg<unsigned_char>::size((CImg<unsigned_char> *)ptrd_1);
                ptrs_1 != (uchar *)0x0; ptrs_1 = ptrs_1 + -(ulong)(uint)img_1) {
              tVar8 = cimg::min<unsigned_long,unsigned_long>
                                ((unsigned_long *)&ptrs_1,(unsigned_long *)&nfile);
              CImg<unsigned_char>::assign((CImg<unsigned_char> *)&img_1,(uint)tVar8,1,1,1);
              cimg::fread<unsigned_char>((uchar *)raw_1._16_8_,(ulong)(uint)img_1,(FILE *)local_5c8)
              ;
              bVar11 = cimg::endianness();
              uVar4 = raw_1._16_8_;
              if (tmp._data._6_1_ != bVar11) {
                uVar9 = CImg<unsigned_char>::size((CImg<unsigned_char> *)&img_1);
                cimg::invert_endianness<unsigned_char>((uchar *)uVar4,uVar9);
              }
              off_1 = raw_1._16_8_;
              for (uStack_188 = (ulong)(uint)img_1; uStack_188 != 0; uStack_188 = uStack_188 - 1) {
                *(undefined1 *)to_read_1 = *(undefined1 *)off_1;
                off_1 = off_1 + 1;
                to_read_1 = to_read_1 + 1;
              }
            }
            CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&img_1);
          }
        }
        bVar11 = true;
      }
    }
    if (!bVar11) {
      pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_endian._data);
      iVar5 = cimg::strcasecmp("uchar",pcVar6);
      if (iVar5 == 0) {
        for (raw_2._data._4_4_ = 0; raw_2._data._4_4_ < H; raw_2._data._4_4_ = raw_2._data._4_4_ + 1
            ) {
          W = 0;
          while( true ) {
            iVar5 = fgetc(local_5c8);
            bVar11 = false;
            if ((iVar5 != 10) && (bVar11 = false, -1 < iVar5)) {
              bVar11 = W < 0xff;
            }
            if (!bVar11) break;
            pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
            pcVar6[W] = (char)iVar5;
            W = W + 1;
          }
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          pcVar6[W] = '\0';
          csiz._0_4_ = 0;
          csiz._4_4_ = 0;
          C = 0;
          D = 0;
          _err = 0;
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          piVar12 = &err;
          iVar5 = __isoc99_sscanf(pcVar6,"%u %u %u %u #%lu",&D,&C,(long)&csiz + 4,&csiz,piVar12);
          uVar13 = (undefined4)((ulong)piVar12 >> 0x20);
          uVar14 = (undefined4)((ulong)in_stack_fffffffffffff180 >> 0x20);
          if (iVar5 < 4) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            uVar1 = this->_width;
            uVar2 = this->_allocated_width;
            pCVar3 = this->_data;
            pcVar6 = pixel_type();
            if (local_38 == (char *)0x0) {
              local_768 = "(FILE*)";
            }
            else {
              local_768 = local_38;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                       ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,CONCAT44(uVar13,D),
                       CONCAT44(uVar14,C),csiz._4_4_,(uint)csiz,raw_2._data._4_4_,local_768);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
          }
          if (D * C * csiz._4_4_ * (uint)csiz != 0) {
            CImg<unsigned_char>::CImg((CImg<unsigned_char> *)&img_2);
            ptrd_2 = (uchar *)(this->_data + raw_2._data._4_4_);
            if (iVar5 == 5) {
              pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
              uVar1 = this->_width;
              uVar2 = this->_allocated_width;
              pCVar3 = this->_data;
              pcVar6 = pixel_type();
              if (local_38 == (char *)0x0) {
                local_790 = "(FILE*)";
              }
              else {
                local_790 = local_38;
              }
              CImgIOException::CImgIOException
                        (pCVar7,
                         "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                         ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,local_790);
              __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
            }
            CImg<unsigned_char>::assign((CImg<unsigned_char> *)ptrd_2,D,C,csiz._4_4_,(uint)csiz);
            to_read_2 = *(unsigned_long *)(ptrd_2 + 0x18);
            for (ptrs_2 = (uchar *)CImg<unsigned_char>::size((CImg<unsigned_char> *)ptrd_2);
                ptrs_2 != (uchar *)0x0; ptrs_2 = ptrs_2 + -(ulong)(uint)img_2) {
              tVar8 = cimg::min<unsigned_long,unsigned_long>
                                ((unsigned_long *)&ptrs_2,(unsigned_long *)&nfile);
              CImg<unsigned_char>::assign((CImg<unsigned_char> *)&img_2,(uint)tVar8,1,1,1);
              cimg::fread<unsigned_char>((uchar *)raw_2._16_8_,(ulong)(uint)img_2,(FILE *)local_5c8)
              ;
              bVar11 = cimg::endianness();
              uVar4 = raw_2._16_8_;
              if (tmp._data._6_1_ != bVar11) {
                uVar9 = CImg<unsigned_char>::size((CImg<unsigned_char> *)&img_2);
                cimg::invert_endianness<unsigned_char>((uchar *)uVar4,uVar9);
              }
              off_2 = raw_2._16_8_;
              for (uStack_1d8 = (ulong)(uint)img_2; uStack_1d8 != 0; uStack_1d8 = uStack_1d8 - 1) {
                *(undefined1 *)to_read_2 = *(undefined1 *)off_2;
                off_2 = off_2 + 1;
                to_read_2 = to_read_2 + 1;
              }
            }
            CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&img_2);
          }
        }
        bVar11 = true;
      }
    }
    if (!bVar11) {
      pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_endian._data);
      iVar5 = cimg::strcasecmp("char",pcVar6);
      if (iVar5 == 0) {
        for (raw_3._data._4_4_ = 0; raw_3._data._4_4_ < H; raw_3._data._4_4_ = raw_3._data._4_4_ + 1
            ) {
          W = 0;
          while( true ) {
            iVar5 = fgetc(local_5c8);
            bVar11 = false;
            if ((iVar5 != 10) && (bVar11 = false, -1 < iVar5)) {
              bVar11 = W < 0xff;
            }
            if (!bVar11) break;
            pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
            pcVar6[W] = (char)iVar5;
            W = W + 1;
          }
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          pcVar6[W] = '\0';
          csiz._0_4_ = 0;
          csiz._4_4_ = 0;
          C = 0;
          D = 0;
          _err = 0;
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          piVar12 = &err;
          iVar5 = __isoc99_sscanf(pcVar6,"%u %u %u %u #%lu",&D,&C,(long)&csiz + 4,&csiz,piVar12);
          uVar13 = (undefined4)((ulong)piVar12 >> 0x20);
          uVar14 = (undefined4)((ulong)in_stack_fffffffffffff180 >> 0x20);
          if (iVar5 < 4) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            uVar1 = this->_width;
            uVar2 = this->_allocated_width;
            pCVar3 = this->_data;
            pcVar6 = pixel_type();
            if (local_38 == (char *)0x0) {
              local_7f0 = "(FILE*)";
            }
            else {
              local_7f0 = local_38;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                       ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,CONCAT44(uVar13,D),
                       CONCAT44(uVar14,C),csiz._4_4_,(uint)csiz,raw_3._data._4_4_,local_7f0);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
          }
          if (D * C * csiz._4_4_ * (uint)csiz != 0) {
            CImg<char>::CImg((CImg<char> *)&img_3);
            ptrd_3 = (uchar *)(this->_data + raw_3._data._4_4_);
            if (iVar5 == 5) {
              pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
              uVar1 = this->_width;
              uVar2 = this->_allocated_width;
              pCVar3 = this->_data;
              pcVar6 = pixel_type();
              if (local_38 == (char *)0x0) {
                local_818 = "(FILE*)";
              }
              else {
                local_818 = local_38;
              }
              CImgIOException::CImgIOException
                        (pCVar7,
                         "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                         ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,local_818);
              __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
            }
            CImg<unsigned_char>::assign((CImg<unsigned_char> *)ptrd_3,D,C,csiz._4_4_,(uint)csiz);
            to_read_3 = *(unsigned_long *)(ptrd_3 + 0x18);
            for (ptrs_3 = (char *)CImg<unsigned_char>::size((CImg<unsigned_char> *)ptrd_3);
                ptrs_3 != (char *)0x0; ptrs_3 = ptrs_3 + -(ulong)(uint)img_3) {
              tVar8 = cimg::min<unsigned_long,unsigned_long>
                                ((unsigned_long *)&ptrs_3,(unsigned_long *)&nfile);
              CImg<char>::assign((CImg<char> *)&img_3,(uint)tVar8,1,1,1);
              cimg::fread<char>((char *)raw_3._16_8_,(ulong)(uint)img_3,(FILE *)local_5c8);
              bVar11 = cimg::endianness();
              uVar4 = raw_3._16_8_;
              if (tmp._data._6_1_ != bVar11) {
                uVar9 = CImg<char>::size((CImg<char> *)&img_3);
                cimg::invert_endianness<char>((char *)uVar4,uVar9);
              }
              off_3 = raw_3._16_8_;
              for (uStack_228 = (ulong)(uint)img_3; uStack_228 != 0; uStack_228 = uStack_228 - 1) {
                *(undefined1 *)to_read_3 = *(undefined1 *)off_3;
                off_3 = off_3 + 1;
                to_read_3 = to_read_3 + 1;
              }
            }
            CImg<char>::~CImg((CImg<char> *)&img_3);
          }
        }
        bVar11 = true;
      }
    }
    if (!bVar11) {
      pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_endian._data);
      iVar5 = cimg::strcasecmp("unsigned_short",pcVar6);
      if (iVar5 == 0) {
        for (raw_4._data._4_4_ = 0; raw_4._data._4_4_ < H; raw_4._data._4_4_ = raw_4._data._4_4_ + 1
            ) {
          W = 0;
          while( true ) {
            iVar5 = fgetc(local_5c8);
            bVar11 = false;
            if ((iVar5 != 10) && (bVar11 = false, -1 < iVar5)) {
              bVar11 = W < 0xff;
            }
            if (!bVar11) break;
            pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
            pcVar6[W] = (char)iVar5;
            W = W + 1;
          }
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          pcVar6[W] = '\0';
          csiz._0_4_ = 0;
          csiz._4_4_ = 0;
          C = 0;
          D = 0;
          _err = 0;
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          piVar12 = &err;
          iVar5 = __isoc99_sscanf(pcVar6,"%u %u %u %u #%lu",&D,&C,(long)&csiz + 4,&csiz,piVar12);
          uVar13 = (undefined4)((ulong)piVar12 >> 0x20);
          uVar14 = (undefined4)((ulong)in_stack_fffffffffffff180 >> 0x20);
          if (iVar5 < 4) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            uVar1 = this->_width;
            uVar2 = this->_allocated_width;
            pCVar3 = this->_data;
            pcVar6 = pixel_type();
            if (local_38 == (char *)0x0) {
              local_878 = "(FILE*)";
            }
            else {
              local_878 = local_38;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                       ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,CONCAT44(uVar13,D),
                       CONCAT44(uVar14,C),csiz._4_4_,(uint)csiz,raw_4._data._4_4_,local_878);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
          }
          if (D * C * csiz._4_4_ * (uint)csiz != 0) {
            CImg<unsigned_short>::CImg((CImg<unsigned_short> *)&img_4);
            ptrd_4 = (uchar *)(this->_data + raw_4._data._4_4_);
            if (iVar5 == 5) {
              pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
              uVar1 = this->_width;
              uVar2 = this->_allocated_width;
              pCVar3 = this->_data;
              pcVar6 = pixel_type();
              if (local_38 == (char *)0x0) {
                local_8a0 = "(FILE*)";
              }
              else {
                local_8a0 = local_38;
              }
              CImgIOException::CImgIOException
                        (pCVar7,
                         "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                         ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,local_8a0);
              __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
            }
            CImg<unsigned_char>::assign((CImg<unsigned_char> *)ptrd_4,D,C,csiz._4_4_,(uint)csiz);
            to_read_4 = *(unsigned_long *)(ptrd_4 + 0x18);
            for (ptrs_4 = (unsigned_short *)CImg<unsigned_char>::size((CImg<unsigned_char> *)ptrd_4)
                ; ptrs_4 != (unsigned_short *)0x0;
                ptrs_4 = (unsigned_short *)((long)ptrs_4 - (ulong)(uint)img_4)) {
              tVar8 = cimg::min<unsigned_long,unsigned_long>
                                ((unsigned_long *)&ptrs_4,(unsigned_long *)&nfile);
              CImg<unsigned_short>::assign((CImg<unsigned_short> *)&img_4,(uint)tVar8,1,1,1);
              cimg::fread<unsigned_short>
                        ((unsigned_short *)raw_4._16_8_,(ulong)(uint)img_4,(FILE *)local_5c8);
              bVar11 = cimg::endianness();
              uVar4 = raw_4._16_8_;
              if (tmp._data._6_1_ != bVar11) {
                uVar9 = CImg<unsigned_short>::size((CImg<unsigned_short> *)&img_4);
                cimg::invert_endianness<unsigned_short>((unsigned_short *)uVar4,uVar9);
              }
              off_4 = raw_4._16_8_;
              for (uStack_278 = (ulong)(uint)img_4; uStack_278 != 0; uStack_278 = uStack_278 - 1) {
                *(char *)to_read_4 = (char)*(undefined2 *)off_4;
                off_4 = off_4 + 2;
                to_read_4 = to_read_4 + 1;
              }
            }
            CImg<unsigned_short>::~CImg((CImg<unsigned_short> *)&img_4);
          }
        }
        bVar11 = true;
      }
    }
    if (!bVar11) {
      pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_endian._data);
      iVar5 = cimg::strcasecmp("ushort",pcVar6);
      if (iVar5 == 0) {
        for (raw_5._data._4_4_ = 0; raw_5._data._4_4_ < H; raw_5._data._4_4_ = raw_5._data._4_4_ + 1
            ) {
          W = 0;
          while( true ) {
            iVar5 = fgetc(local_5c8);
            bVar11 = false;
            if ((iVar5 != 10) && (bVar11 = false, -1 < iVar5)) {
              bVar11 = W < 0xff;
            }
            if (!bVar11) break;
            pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
            pcVar6[W] = (char)iVar5;
            W = W + 1;
          }
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          pcVar6[W] = '\0';
          csiz._0_4_ = 0;
          csiz._4_4_ = 0;
          C = 0;
          D = 0;
          _err = 0;
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          piVar12 = &err;
          iVar5 = __isoc99_sscanf(pcVar6,"%u %u %u %u #%lu",&D,&C,(long)&csiz + 4,&csiz,piVar12);
          uVar13 = (undefined4)((ulong)piVar12 >> 0x20);
          uVar14 = (undefined4)((ulong)in_stack_fffffffffffff180 >> 0x20);
          if (iVar5 < 4) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            uVar1 = this->_width;
            uVar2 = this->_allocated_width;
            pCVar3 = this->_data;
            pcVar6 = pixel_type();
            if (local_38 == (char *)0x0) {
              local_900 = "(FILE*)";
            }
            else {
              local_900 = local_38;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                       ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,CONCAT44(uVar13,D),
                       CONCAT44(uVar14,C),csiz._4_4_,(uint)csiz,raw_5._data._4_4_,local_900);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
          }
          if (D * C * csiz._4_4_ * (uint)csiz != 0) {
            CImg<unsigned_short>::CImg((CImg<unsigned_short> *)&img_5);
            ptrd_5 = (uchar *)(this->_data + raw_5._data._4_4_);
            if (iVar5 == 5) {
              pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
              uVar1 = this->_width;
              uVar2 = this->_allocated_width;
              pCVar3 = this->_data;
              pcVar6 = pixel_type();
              if (local_38 == (char *)0x0) {
                local_928 = "(FILE*)";
              }
              else {
                local_928 = local_38;
              }
              CImgIOException::CImgIOException
                        (pCVar7,
                         "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                         ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,local_928);
              __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
            }
            CImg<unsigned_char>::assign((CImg<unsigned_char> *)ptrd_5,D,C,csiz._4_4_,(uint)csiz);
            to_read_5 = *(unsigned_long *)(ptrd_5 + 0x18);
            for (ptrs_5 = (unsigned_short *)CImg<unsigned_char>::size((CImg<unsigned_char> *)ptrd_5)
                ; ptrs_5 != (unsigned_short *)0x0;
                ptrs_5 = (unsigned_short *)((long)ptrs_5 - (ulong)(uint)img_5)) {
              tVar8 = cimg::min<unsigned_long,unsigned_long>
                                ((unsigned_long *)&ptrs_5,(unsigned_long *)&nfile);
              CImg<unsigned_short>::assign((CImg<unsigned_short> *)&img_5,(uint)tVar8,1,1,1);
              cimg::fread<unsigned_short>
                        ((unsigned_short *)raw_5._16_8_,(ulong)(uint)img_5,(FILE *)local_5c8);
              bVar11 = cimg::endianness();
              uVar4 = raw_5._16_8_;
              if (tmp._data._6_1_ != bVar11) {
                uVar9 = CImg<unsigned_short>::size((CImg<unsigned_short> *)&img_5);
                cimg::invert_endianness<unsigned_short>((unsigned_short *)uVar4,uVar9);
              }
              off_5 = raw_5._16_8_;
              for (uStack_2c8 = (ulong)(uint)img_5; uStack_2c8 != 0; uStack_2c8 = uStack_2c8 - 1) {
                *(char *)to_read_5 = (char)*(undefined2 *)off_5;
                off_5 = off_5 + 2;
                to_read_5 = to_read_5 + 1;
              }
            }
            CImg<unsigned_short>::~CImg((CImg<unsigned_short> *)&img_5);
          }
        }
        bVar11 = true;
      }
    }
    if (!bVar11) {
      pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_endian._data);
      iVar5 = cimg::strcasecmp("short",pcVar6);
      if (iVar5 == 0) {
        for (raw_6._data._4_4_ = 0; raw_6._data._4_4_ < H; raw_6._data._4_4_ = raw_6._data._4_4_ + 1
            ) {
          W = 0;
          while( true ) {
            iVar5 = fgetc(local_5c8);
            bVar11 = false;
            if ((iVar5 != 10) && (bVar11 = false, -1 < iVar5)) {
              bVar11 = W < 0xff;
            }
            if (!bVar11) break;
            pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
            pcVar6[W] = (char)iVar5;
            W = W + 1;
          }
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          pcVar6[W] = '\0';
          csiz._0_4_ = 0;
          csiz._4_4_ = 0;
          C = 0;
          D = 0;
          _err = 0;
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          piVar12 = &err;
          iVar5 = __isoc99_sscanf(pcVar6,"%u %u %u %u #%lu",&D,&C,(long)&csiz + 4,&csiz,piVar12);
          uVar13 = (undefined4)((ulong)piVar12 >> 0x20);
          uVar14 = (undefined4)((ulong)in_stack_fffffffffffff180 >> 0x20);
          if (iVar5 < 4) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            uVar1 = this->_width;
            uVar2 = this->_allocated_width;
            pCVar3 = this->_data;
            pcVar6 = pixel_type();
            if (local_38 == (char *)0x0) {
              local_988 = "(FILE*)";
            }
            else {
              local_988 = local_38;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                       ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,CONCAT44(uVar13,D),
                       CONCAT44(uVar14,C),csiz._4_4_,(uint)csiz,raw_6._data._4_4_,local_988);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
          }
          if (D * C * csiz._4_4_ * (uint)csiz != 0) {
            CImg<short>::CImg((CImg<short> *)&img_6);
            ptrd_6 = (uchar *)(this->_data + raw_6._data._4_4_);
            if (iVar5 == 5) {
              pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
              uVar1 = this->_width;
              uVar2 = this->_allocated_width;
              pCVar3 = this->_data;
              pcVar6 = pixel_type();
              if (local_38 == (char *)0x0) {
                local_9b0 = "(FILE*)";
              }
              else {
                local_9b0 = local_38;
              }
              CImgIOException::CImgIOException
                        (pCVar7,
                         "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                         ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,local_9b0);
              __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
            }
            CImg<unsigned_char>::assign((CImg<unsigned_char> *)ptrd_6,D,C,csiz._4_4_,(uint)csiz);
            to_read_6 = *(unsigned_long *)(ptrd_6 + 0x18);
            for (ptrs_6 = (short *)CImg<unsigned_char>::size((CImg<unsigned_char> *)ptrd_6);
                ptrs_6 != (short *)0x0; ptrs_6 = (short *)((long)ptrs_6 - (ulong)(uint)img_6)) {
              tVar8 = cimg::min<unsigned_long,unsigned_long>
                                ((unsigned_long *)&ptrs_6,(unsigned_long *)&nfile);
              CImg<short>::assign((CImg<short> *)&img_6,(uint)tVar8,1,1,1);
              cimg::fread<short>((short *)raw_6._16_8_,(ulong)(uint)img_6,(FILE *)local_5c8);
              bVar11 = cimg::endianness();
              uVar4 = raw_6._16_8_;
              if (tmp._data._6_1_ != bVar11) {
                uVar9 = CImg<short>::size((CImg<short> *)&img_6);
                cimg::invert_endianness<short>((short *)uVar4,uVar9);
              }
              off_6 = raw_6._16_8_;
              for (uStack_318 = (ulong)(uint)img_6; uStack_318 != 0; uStack_318 = uStack_318 - 1) {
                *(char *)to_read_6 = (char)*(undefined2 *)off_6;
                off_6 = off_6 + 2;
                to_read_6 = to_read_6 + 1;
              }
            }
            CImg<short>::~CImg((CImg<short> *)&img_6);
          }
        }
        bVar11 = true;
      }
    }
    if (!bVar11) {
      pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_endian._data);
      iVar5 = cimg::strcasecmp("unsigned_int",pcVar6);
      if (iVar5 == 0) {
        for (raw_7._data._4_4_ = 0; raw_7._data._4_4_ < H; raw_7._data._4_4_ = raw_7._data._4_4_ + 1
            ) {
          W = 0;
          while( true ) {
            iVar5 = fgetc(local_5c8);
            bVar11 = false;
            if ((iVar5 != 10) && (bVar11 = false, -1 < iVar5)) {
              bVar11 = W < 0xff;
            }
            if (!bVar11) break;
            pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
            pcVar6[W] = (char)iVar5;
            W = W + 1;
          }
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          pcVar6[W] = '\0';
          csiz._0_4_ = 0;
          csiz._4_4_ = 0;
          C = 0;
          D = 0;
          _err = 0;
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          piVar12 = &err;
          iVar5 = __isoc99_sscanf(pcVar6,"%u %u %u %u #%lu",&D,&C,(long)&csiz + 4,&csiz,piVar12);
          uVar13 = (undefined4)((ulong)piVar12 >> 0x20);
          uVar14 = (undefined4)((ulong)in_stack_fffffffffffff180 >> 0x20);
          if (iVar5 < 4) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            uVar1 = this->_width;
            uVar2 = this->_allocated_width;
            pCVar3 = this->_data;
            pcVar6 = pixel_type();
            if (local_38 == (char *)0x0) {
              local_a18 = "(FILE*)";
            }
            else {
              local_a18 = local_38;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                       ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,CONCAT44(uVar13,D),
                       CONCAT44(uVar14,C),csiz._4_4_,(uint)csiz,raw_7._data._4_4_,local_a18);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
          }
          if (D * C * csiz._4_4_ * (uint)csiz != 0) {
            CImg<unsigned_int>::CImg((CImg<unsigned_int> *)&img_7);
            ptrd_7 = (uchar *)(this->_data + raw_7._data._4_4_);
            if (iVar5 == 5) {
              pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
              uVar1 = this->_width;
              uVar2 = this->_allocated_width;
              pCVar3 = this->_data;
              pcVar6 = pixel_type();
              if (local_38 == (char *)0x0) {
                local_a40 = "(FILE*)";
              }
              else {
                local_a40 = local_38;
              }
              CImgIOException::CImgIOException
                        (pCVar7,
                         "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                         ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,local_a40);
              __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
            }
            CImg<unsigned_char>::assign((CImg<unsigned_char> *)ptrd_7,D,C,csiz._4_4_,(uint)csiz);
            to_read_7 = *(unsigned_long *)(ptrd_7 + 0x18);
            for (ptrs_7 = (uint *)CImg<unsigned_char>::size((CImg<unsigned_char> *)ptrd_7);
                ptrs_7 != (uint *)0x0; ptrs_7 = (uint *)((long)ptrs_7 - (ulong)(uint)img_7)) {
              tVar8 = cimg::min<unsigned_long,unsigned_long>
                                ((unsigned_long *)&ptrs_7,(unsigned_long *)&nfile);
              CImg<unsigned_int>::assign((CImg<unsigned_int> *)&img_7,(uint)tVar8,1,1,1);
              cimg::fread<unsigned_int>((uint *)raw_7._16_8_,(ulong)(uint)img_7,(FILE *)local_5c8);
              bVar11 = cimg::endianness();
              uVar4 = raw_7._16_8_;
              if (tmp._data._6_1_ != bVar11) {
                uVar9 = CImg<unsigned_int>::size((CImg<unsigned_int> *)&img_7);
                cimg::invert_endianness<unsigned_int>((uint *)uVar4,uVar9);
              }
              off_7 = raw_7._16_8_;
              for (uStack_368 = (ulong)(uint)img_7; uStack_368 != 0; uStack_368 = uStack_368 - 1) {
                *(char *)to_read_7 = (char)*(undefined4 *)off_7;
                off_7 = off_7 + 4;
                to_read_7 = to_read_7 + 1;
              }
            }
            CImg<unsigned_int>::~CImg((CImg<unsigned_int> *)&img_7);
          }
        }
        bVar11 = true;
      }
    }
    if (!bVar11) {
      pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_endian._data);
      iVar5 = cimg::strcasecmp("uint",pcVar6);
      if (iVar5 == 0) {
        for (raw_8._data._4_4_ = 0; raw_8._data._4_4_ < H; raw_8._data._4_4_ = raw_8._data._4_4_ + 1
            ) {
          W = 0;
          while( true ) {
            iVar5 = fgetc(local_5c8);
            bVar11 = false;
            if ((iVar5 != 10) && (bVar11 = false, -1 < iVar5)) {
              bVar11 = W < 0xff;
            }
            if (!bVar11) break;
            pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
            pcVar6[W] = (char)iVar5;
            W = W + 1;
          }
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          pcVar6[W] = '\0';
          csiz._0_4_ = 0;
          csiz._4_4_ = 0;
          C = 0;
          D = 0;
          _err = 0;
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          piVar12 = &err;
          iVar5 = __isoc99_sscanf(pcVar6,"%u %u %u %u #%lu",&D,&C,(long)&csiz + 4,&csiz,piVar12);
          uVar13 = (undefined4)((ulong)piVar12 >> 0x20);
          uVar14 = (undefined4)((ulong)in_stack_fffffffffffff180 >> 0x20);
          if (iVar5 < 4) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            uVar1 = this->_width;
            uVar2 = this->_allocated_width;
            pCVar3 = this->_data;
            pcVar6 = pixel_type();
            if (local_38 == (char *)0x0) {
              local_aa0 = "(FILE*)";
            }
            else {
              local_aa0 = local_38;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                       ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,CONCAT44(uVar13,D),
                       CONCAT44(uVar14,C),csiz._4_4_,(uint)csiz,raw_8._data._4_4_,local_aa0);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
          }
          if (D * C * csiz._4_4_ * (uint)csiz != 0) {
            CImg<unsigned_int>::CImg((CImg<unsigned_int> *)&img_8);
            ptrd_8 = (uchar *)(this->_data + raw_8._data._4_4_);
            if (iVar5 == 5) {
              pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
              uVar1 = this->_width;
              uVar2 = this->_allocated_width;
              pCVar3 = this->_data;
              pcVar6 = pixel_type();
              if (local_38 == (char *)0x0) {
                local_ac8 = "(FILE*)";
              }
              else {
                local_ac8 = local_38;
              }
              CImgIOException::CImgIOException
                        (pCVar7,
                         "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                         ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,local_ac8);
              __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
            }
            CImg<unsigned_char>::assign((CImg<unsigned_char> *)ptrd_8,D,C,csiz._4_4_,(uint)csiz);
            to_read_8 = *(unsigned_long *)(ptrd_8 + 0x18);
            for (ptrs_8 = (uint *)CImg<unsigned_char>::size((CImg<unsigned_char> *)ptrd_8);
                ptrs_8 != (uint *)0x0; ptrs_8 = (uint *)((long)ptrs_8 - (ulong)(uint)img_8)) {
              tVar8 = cimg::min<unsigned_long,unsigned_long>
                                ((unsigned_long *)&ptrs_8,(unsigned_long *)&nfile);
              CImg<unsigned_int>::assign((CImg<unsigned_int> *)&img_8,(uint)tVar8,1,1,1);
              cimg::fread<unsigned_int>((uint *)raw_8._16_8_,(ulong)(uint)img_8,(FILE *)local_5c8);
              bVar11 = cimg::endianness();
              uVar4 = raw_8._16_8_;
              if (tmp._data._6_1_ != bVar11) {
                uVar9 = CImg<unsigned_int>::size((CImg<unsigned_int> *)&img_8);
                cimg::invert_endianness<unsigned_int>((uint *)uVar4,uVar9);
              }
              off_8 = raw_8._16_8_;
              for (uStack_3b8 = (ulong)(uint)img_8; uStack_3b8 != 0; uStack_3b8 = uStack_3b8 - 1) {
                *(char *)to_read_8 = (char)*(undefined4 *)off_8;
                off_8 = off_8 + 4;
                to_read_8 = to_read_8 + 1;
              }
            }
            CImg<unsigned_int>::~CImg((CImg<unsigned_int> *)&img_8);
          }
        }
        bVar11 = true;
      }
    }
    if (!bVar11) {
      pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_endian._data);
      iVar5 = cimg::strcasecmp("int",pcVar6);
      if (iVar5 == 0) {
        for (raw_9._data._4_4_ = 0; raw_9._data._4_4_ < H; raw_9._data._4_4_ = raw_9._data._4_4_ + 1
            ) {
          W = 0;
          while( true ) {
            iVar5 = fgetc(local_5c8);
            bVar11 = false;
            if ((iVar5 != 10) && (bVar11 = false, -1 < iVar5)) {
              bVar11 = W < 0xff;
            }
            if (!bVar11) break;
            pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
            pcVar6[W] = (char)iVar5;
            W = W + 1;
          }
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          pcVar6[W] = '\0';
          csiz._0_4_ = 0;
          csiz._4_4_ = 0;
          C = 0;
          D = 0;
          _err = 0;
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          piVar12 = &err;
          iVar5 = __isoc99_sscanf(pcVar6,"%u %u %u %u #%lu",&D,&C,(long)&csiz + 4,&csiz,piVar12);
          uVar13 = (undefined4)((ulong)piVar12 >> 0x20);
          uVar14 = (undefined4)((ulong)in_stack_fffffffffffff180 >> 0x20);
          if (iVar5 < 4) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            uVar1 = this->_width;
            uVar2 = this->_allocated_width;
            pCVar3 = this->_data;
            pcVar6 = pixel_type();
            if (local_38 == (char *)0x0) {
              local_b28 = "(FILE*)";
            }
            else {
              local_b28 = local_38;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                       ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,CONCAT44(uVar13,D),
                       CONCAT44(uVar14,C),csiz._4_4_,(uint)csiz,raw_9._data._4_4_,local_b28);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
          }
          if (D * C * csiz._4_4_ * (uint)csiz != 0) {
            CImg<int>::CImg((CImg<int> *)&img_9);
            ptrd_9 = (uchar *)(this->_data + raw_9._data._4_4_);
            if (iVar5 == 5) {
              pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
              uVar1 = this->_width;
              uVar2 = this->_allocated_width;
              pCVar3 = this->_data;
              pcVar6 = pixel_type();
              if (local_38 == (char *)0x0) {
                local_b50 = "(FILE*)";
              }
              else {
                local_b50 = local_38;
              }
              CImgIOException::CImgIOException
                        (pCVar7,
                         "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                         ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,local_b50);
              __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
            }
            CImg<unsigned_char>::assign((CImg<unsigned_char> *)ptrd_9,D,C,csiz._4_4_,(uint)csiz);
            to_read_9 = *(unsigned_long *)(ptrd_9 + 0x18);
            for (ptrs_9 = (int *)CImg<unsigned_char>::size((CImg<unsigned_char> *)ptrd_9);
                ptrs_9 != (int *)0x0; ptrs_9 = (int *)((long)ptrs_9 - (ulong)(uint)img_9)) {
              tVar8 = cimg::min<unsigned_long,unsigned_long>
                                ((unsigned_long *)&ptrs_9,(unsigned_long *)&nfile);
              CImg<int>::assign((CImg<int> *)&img_9,(uint)tVar8,1,1,1);
              cimg::fread<int>((int *)raw_9._16_8_,(ulong)(uint)img_9,(FILE *)local_5c8);
              bVar11 = cimg::endianness();
              uVar4 = raw_9._16_8_;
              if (tmp._data._6_1_ != bVar11) {
                uVar9 = CImg<int>::size((CImg<int> *)&img_9);
                cimg::invert_endianness<int>((int *)uVar4,uVar9);
              }
              off_9 = raw_9._16_8_;
              for (uStack_408 = (ulong)(uint)img_9; uStack_408 != 0; uStack_408 = uStack_408 - 1) {
                *(char *)to_read_9 = (char)*(undefined4 *)off_9;
                off_9 = off_9 + 4;
                to_read_9 = to_read_9 + 1;
              }
            }
            CImg<int>::~CImg((CImg<int> *)&img_9);
          }
        }
        bVar11 = true;
      }
    }
    if (!bVar11) {
      pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_endian._data);
      iVar5 = cimg::strcasecmp("unsigned_long",pcVar6);
      if (iVar5 == 0) {
        for (raw_10._data._4_4_ = 0; raw_10._data._4_4_ < H;
            raw_10._data._4_4_ = raw_10._data._4_4_ + 1) {
          W = 0;
          while( true ) {
            iVar5 = fgetc(local_5c8);
            bVar11 = false;
            if ((iVar5 != 10) && (bVar11 = false, -1 < iVar5)) {
              bVar11 = W < 0xff;
            }
            if (!bVar11) break;
            pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
            pcVar6[W] = (char)iVar5;
            W = W + 1;
          }
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          pcVar6[W] = '\0';
          csiz._0_4_ = 0;
          csiz._4_4_ = 0;
          C = 0;
          D = 0;
          _err = 0;
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          piVar12 = &err;
          iVar5 = __isoc99_sscanf(pcVar6,"%u %u %u %u #%lu",&D,&C,(long)&csiz + 4,&csiz,piVar12);
          uVar13 = (undefined4)((ulong)piVar12 >> 0x20);
          uVar14 = (undefined4)((ulong)in_stack_fffffffffffff180 >> 0x20);
          if (iVar5 < 4) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            uVar1 = this->_width;
            uVar2 = this->_allocated_width;
            pCVar3 = this->_data;
            pcVar6 = pixel_type();
            if (local_38 == (char *)0x0) {
              local_bb0 = "(FILE*)";
            }
            else {
              local_bb0 = local_38;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                       ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,CONCAT44(uVar13,D),
                       CONCAT44(uVar14,C),csiz._4_4_,(uint)csiz,raw_10._data._4_4_,local_bb0);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
          }
          if (D * C * csiz._4_4_ * (uint)csiz != 0) {
            CImg<unsigned_long>::CImg((CImg<unsigned_long> *)&img_10);
            ptrd_10 = (uchar *)(this->_data + raw_10._data._4_4_);
            if (iVar5 == 5) {
              pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
              uVar1 = this->_width;
              uVar2 = this->_allocated_width;
              pCVar3 = this->_data;
              pcVar6 = pixel_type();
              if (local_38 == (char *)0x0) {
                local_bd8 = "(FILE*)";
              }
              else {
                local_bd8 = local_38;
              }
              CImgIOException::CImgIOException
                        (pCVar7,
                         "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                         ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,local_bd8);
              __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
            }
            CImg<unsigned_char>::assign((CImg<unsigned_char> *)ptrd_10,D,C,csiz._4_4_,(uint)csiz);
            to_read_10 = *(unsigned_long *)(ptrd_10 + 0x18);
            for (ptrs_10 = (unsigned_long *)
                           CImg<unsigned_char>::size((CImg<unsigned_char> *)ptrd_10);
                ptrs_10 != (unsigned_long *)0x0;
                ptrs_10 = (unsigned_long *)((long)ptrs_10 - (ulong)(uint)img_10)) {
              tVar8 = cimg::min<unsigned_long,unsigned_long>
                                ((unsigned_long *)&ptrs_10,(unsigned_long *)&nfile);
              CImg<unsigned_long>::assign((CImg<unsigned_long> *)&img_10,(uint)tVar8,1,1,1);
              cimg::fread<unsigned_long>
                        ((unsigned_long *)raw_10._16_8_,(ulong)(uint)img_10,(FILE *)local_5c8);
              bVar11 = cimg::endianness();
              uVar4 = raw_10._16_8_;
              if (tmp._data._6_1_ != bVar11) {
                uVar9 = CImg<unsigned_long>::size((CImg<unsigned_long> *)&img_10);
                cimg::invert_endianness<unsigned_long>((unsigned_long *)uVar4,uVar9);
              }
              off_10 = raw_10._16_8_;
              for (uStack_458 = (ulong)(uint)img_10; uStack_458 != 0; uStack_458 = uStack_458 - 1) {
                *(char *)to_read_10 = (char)*(undefined8 *)off_10;
                off_10 = off_10 + 8;
                to_read_10 = to_read_10 + 1;
              }
            }
            CImg<unsigned_long>::~CImg((CImg<unsigned_long> *)&img_10);
          }
        }
        bVar11 = true;
      }
    }
    if (!bVar11) {
      pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_endian._data);
      iVar5 = cimg::strcasecmp("ulong",pcVar6);
      if (iVar5 == 0) {
        for (raw_11._data._4_4_ = 0; raw_11._data._4_4_ < H;
            raw_11._data._4_4_ = raw_11._data._4_4_ + 1) {
          W = 0;
          while( true ) {
            iVar5 = fgetc(local_5c8);
            bVar11 = false;
            if ((iVar5 != 10) && (bVar11 = false, -1 < iVar5)) {
              bVar11 = W < 0xff;
            }
            if (!bVar11) break;
            pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
            pcVar6[W] = (char)iVar5;
            W = W + 1;
          }
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          pcVar6[W] = '\0';
          csiz._0_4_ = 0;
          csiz._4_4_ = 0;
          C = 0;
          D = 0;
          _err = 0;
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          piVar12 = &err;
          iVar5 = __isoc99_sscanf(pcVar6,"%u %u %u %u #%lu",&D,&C,(long)&csiz + 4,&csiz,piVar12);
          uVar13 = (undefined4)((ulong)piVar12 >> 0x20);
          uVar14 = (undefined4)((ulong)in_stack_fffffffffffff180 >> 0x20);
          if (iVar5 < 4) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            uVar1 = this->_width;
            uVar2 = this->_allocated_width;
            pCVar3 = this->_data;
            pcVar6 = pixel_type();
            if (local_38 == (char *)0x0) {
              local_c38 = "(FILE*)";
            }
            else {
              local_c38 = local_38;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                       ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,CONCAT44(uVar13,D),
                       CONCAT44(uVar14,C),csiz._4_4_,(uint)csiz,raw_11._data._4_4_,local_c38);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
          }
          if (D * C * csiz._4_4_ * (uint)csiz != 0) {
            CImg<unsigned_long>::CImg((CImg<unsigned_long> *)&img_11);
            ptrd_11 = (uchar *)(this->_data + raw_11._data._4_4_);
            if (iVar5 == 5) {
              pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
              uVar1 = this->_width;
              uVar2 = this->_allocated_width;
              pCVar3 = this->_data;
              pcVar6 = pixel_type();
              if (local_38 == (char *)0x0) {
                local_c60 = "(FILE*)";
              }
              else {
                local_c60 = local_38;
              }
              CImgIOException::CImgIOException
                        (pCVar7,
                         "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                         ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,local_c60);
              __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
            }
            CImg<unsigned_char>::assign((CImg<unsigned_char> *)ptrd_11,D,C,csiz._4_4_,(uint)csiz);
            to_read_11 = *(unsigned_long *)(ptrd_11 + 0x18);
            for (ptrs_11 = (unsigned_long *)
                           CImg<unsigned_char>::size((CImg<unsigned_char> *)ptrd_11);
                ptrs_11 != (unsigned_long *)0x0;
                ptrs_11 = (unsigned_long *)((long)ptrs_11 - (ulong)(uint)img_11)) {
              tVar8 = cimg::min<unsigned_long,unsigned_long>
                                ((unsigned_long *)&ptrs_11,(unsigned_long *)&nfile);
              CImg<unsigned_long>::assign((CImg<unsigned_long> *)&img_11,(uint)tVar8,1,1,1);
              cimg::fread<unsigned_long>
                        ((unsigned_long *)raw_11._16_8_,(ulong)(uint)img_11,(FILE *)local_5c8);
              bVar11 = cimg::endianness();
              uVar4 = raw_11._16_8_;
              if (tmp._data._6_1_ != bVar11) {
                uVar9 = CImg<unsigned_long>::size((CImg<unsigned_long> *)&img_11);
                cimg::invert_endianness<unsigned_long>((unsigned_long *)uVar4,uVar9);
              }
              off_11 = raw_11._16_8_;
              for (uStack_4a8 = (ulong)(uint)img_11; uStack_4a8 != 0; uStack_4a8 = uStack_4a8 - 1) {
                *(char *)to_read_11 = (char)*(undefined8 *)off_11;
                off_11 = off_11 + 8;
                to_read_11 = to_read_11 + 1;
              }
            }
            CImg<unsigned_long>::~CImg((CImg<unsigned_long> *)&img_11);
          }
        }
        bVar11 = true;
      }
    }
    if (!bVar11) {
      pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_endian._data);
      iVar5 = cimg::strcasecmp("long",pcVar6);
      if (iVar5 == 0) {
        for (raw_12._data._4_4_ = 0; raw_12._data._4_4_ < H;
            raw_12._data._4_4_ = raw_12._data._4_4_ + 1) {
          W = 0;
          while( true ) {
            iVar5 = fgetc(local_5c8);
            bVar11 = false;
            if ((iVar5 != 10) && (bVar11 = false, -1 < iVar5)) {
              bVar11 = W < 0xff;
            }
            if (!bVar11) break;
            pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
            pcVar6[W] = (char)iVar5;
            W = W + 1;
          }
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          pcVar6[W] = '\0';
          csiz._0_4_ = 0;
          csiz._4_4_ = 0;
          C = 0;
          D = 0;
          _err = 0;
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          piVar12 = &err;
          iVar5 = __isoc99_sscanf(pcVar6,"%u %u %u %u #%lu",&D,&C,(long)&csiz + 4,&csiz,piVar12);
          uVar13 = (undefined4)((ulong)piVar12 >> 0x20);
          uVar14 = (undefined4)((ulong)in_stack_fffffffffffff180 >> 0x20);
          if (iVar5 < 4) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            uVar1 = this->_width;
            uVar2 = this->_allocated_width;
            pCVar3 = this->_data;
            pcVar6 = pixel_type();
            if (local_38 == (char *)0x0) {
              local_cc0 = "(FILE*)";
            }
            else {
              local_cc0 = local_38;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                       ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,CONCAT44(uVar13,D),
                       CONCAT44(uVar14,C),csiz._4_4_,(uint)csiz,raw_12._data._4_4_,local_cc0);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
          }
          if (D * C * csiz._4_4_ * (uint)csiz != 0) {
            CImg<long>::CImg((CImg<long> *)&img_12);
            ptrd_12 = (uchar *)(this->_data + raw_12._data._4_4_);
            if (iVar5 == 5) {
              pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
              uVar1 = this->_width;
              uVar2 = this->_allocated_width;
              pCVar3 = this->_data;
              pcVar6 = pixel_type();
              if (local_38 == (char *)0x0) {
                local_ce8 = "(FILE*)";
              }
              else {
                local_ce8 = local_38;
              }
              CImgIOException::CImgIOException
                        (pCVar7,
                         "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                         ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,local_ce8);
              __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
            }
            CImg<unsigned_char>::assign((CImg<unsigned_char> *)ptrd_12,D,C,csiz._4_4_,(uint)csiz);
            to_read_12 = *(unsigned_long *)(ptrd_12 + 0x18);
            for (ptrs_12 = (long *)CImg<unsigned_char>::size((CImg<unsigned_char> *)ptrd_12);
                ptrs_12 != (long *)0x0; ptrs_12 = (long *)((long)ptrs_12 - (ulong)(uint)img_12)) {
              tVar8 = cimg::min<unsigned_long,unsigned_long>
                                ((unsigned_long *)&ptrs_12,(unsigned_long *)&nfile);
              CImg<long>::assign((CImg<long> *)&img_12,(uint)tVar8,1,1,1);
              cimg::fread<long>((long *)raw_12._16_8_,(ulong)(uint)img_12,(FILE *)local_5c8);
              bVar11 = cimg::endianness();
              uVar4 = raw_12._16_8_;
              if (tmp._data._6_1_ != bVar11) {
                uVar9 = CImg<long>::size((CImg<long> *)&img_12);
                cimg::invert_endianness<long>((long *)uVar4,uVar9);
              }
              off_12 = raw_12._16_8_;
              for (uStack_4f8 = (ulong)(uint)img_12; uStack_4f8 != 0; uStack_4f8 = uStack_4f8 - 1) {
                *(char *)to_read_12 = (char)*(undefined8 *)off_12;
                off_12 = off_12 + 8;
                to_read_12 = to_read_12 + 1;
              }
            }
            CImg<long>::~CImg((CImg<long> *)&img_12);
          }
        }
        bVar11 = true;
      }
    }
    if (!bVar11) {
      pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_endian._data);
      iVar5 = cimg::strcasecmp("float",pcVar6);
      if (iVar5 == 0) {
        for (raw_13._data._4_4_ = 0; raw_13._data._4_4_ < H;
            raw_13._data._4_4_ = raw_13._data._4_4_ + 1) {
          W = 0;
          while( true ) {
            iVar5 = fgetc(local_5c8);
            bVar11 = false;
            if ((iVar5 != 10) && (bVar11 = false, -1 < iVar5)) {
              bVar11 = W < 0xff;
            }
            if (!bVar11) break;
            pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
            pcVar6[W] = (char)iVar5;
            W = W + 1;
          }
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          pcVar6[W] = '\0';
          csiz._0_4_ = 0;
          csiz._4_4_ = 0;
          C = 0;
          D = 0;
          _err = 0;
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          piVar12 = &err;
          iVar5 = __isoc99_sscanf(pcVar6,"%u %u %u %u #%lu",&D,&C,(long)&csiz + 4,&csiz,piVar12);
          uVar13 = (undefined4)((ulong)piVar12 >> 0x20);
          uVar14 = (undefined4)((ulong)in_stack_fffffffffffff180 >> 0x20);
          if (iVar5 < 4) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            uVar1 = this->_width;
            uVar2 = this->_allocated_width;
            pCVar3 = this->_data;
            pcVar6 = pixel_type();
            if (local_38 == (char *)0x0) {
              local_d50 = "(FILE*)";
            }
            else {
              local_d50 = local_38;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                       ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,CONCAT44(uVar13,D),
                       CONCAT44(uVar14,C),csiz._4_4_,(uint)csiz,raw_13._data._4_4_,local_d50);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
          }
          if (D * C * csiz._4_4_ * (uint)csiz != 0) {
            CImg<float>::CImg((CImg<float> *)&img_13);
            ptrd_13 = (uchar *)(this->_data + raw_13._data._4_4_);
            if (iVar5 == 5) {
              pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
              uVar1 = this->_width;
              uVar2 = this->_allocated_width;
              pCVar3 = this->_data;
              pcVar6 = pixel_type();
              if (local_38 == (char *)0x0) {
                local_d78 = "(FILE*)";
              }
              else {
                local_d78 = local_38;
              }
              CImgIOException::CImgIOException
                        (pCVar7,
                         "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                         ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,local_d78);
              __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
            }
            CImg<unsigned_char>::assign((CImg<unsigned_char> *)ptrd_13,D,C,csiz._4_4_,(uint)csiz);
            to_read_13 = *(unsigned_long *)(ptrd_13 + 0x18);
            for (ptrs_13 = (float *)CImg<unsigned_char>::size((CImg<unsigned_char> *)ptrd_13);
                ptrs_13 != (float *)0x0; ptrs_13 = (float *)((long)ptrs_13 - (ulong)(uint)img_13)) {
              tVar8 = cimg::min<unsigned_long,unsigned_long>
                                ((unsigned_long *)&ptrs_13,(unsigned_long *)&nfile);
              CImg<float>::assign((CImg<float> *)&img_13,(uint)tVar8,1,1,1);
              cimg::fread<float>((float *)raw_13._16_8_,(ulong)(uint)img_13,(FILE *)local_5c8);
              bVar11 = cimg::endianness();
              uVar4 = raw_13._16_8_;
              if (tmp._data._6_1_ != bVar11) {
                uVar9 = CImg<float>::size((CImg<float> *)&img_13);
                cimg::invert_endianness<float>((float *)uVar4,uVar9);
              }
              off_13 = raw_13._16_8_;
              for (uStack_548 = (ulong)(uint)img_13; uStack_548 != 0; uStack_548 = uStack_548 - 1) {
                *(char *)to_read_13 = (char)(int)*(float *)off_13;
                off_13 = off_13 + 4;
                to_read_13 = to_read_13 + 1;
              }
            }
            CImg<float>::~CImg((CImg<float> *)&img_13);
          }
        }
        bVar11 = true;
      }
    }
    if (!bVar11) {
      pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_endian._data);
      iVar5 = cimg::strcasecmp("double",pcVar6);
      if (iVar5 == 0) {
        for (raw_14._data._4_4_ = 0; raw_14._data._4_4_ < H;
            raw_14._data._4_4_ = raw_14._data._4_4_ + 1) {
          W = 0;
          while( true ) {
            iVar5 = fgetc(local_5c8);
            bVar11 = false;
            if ((iVar5 != 10) && (bVar11 = false, -1 < iVar5)) {
              bVar11 = W < 0xff;
            }
            if (!bVar11) break;
            pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
            pcVar6[W] = (char)iVar5;
            W = W + 1;
          }
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          pcVar6[W] = '\0';
          csiz._0_4_ = 0;
          csiz._4_4_ = 0;
          C = 0;
          D = 0;
          _err = 0;
          pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&str_pixeltype._data);
          piVar12 = &err;
          iVar5 = __isoc99_sscanf(pcVar6,"%u %u %u %u #%lu",&D,&C,(long)&csiz + 4,&csiz,piVar12);
          uVar13 = (undefined4)((ulong)piVar12 >> 0x20);
          uVar14 = (undefined4)((ulong)in_stack_fffffffffffff180 >> 0x20);
          if (iVar5 < 4) {
            pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
            uVar1 = this->_width;
            uVar2 = this->_allocated_width;
            pCVar3 = this->_data;
            pcVar6 = pixel_type();
            if (local_38 == (char *)0x0) {
              local_dd8 = "(FILE*)";
            }
            else {
              local_dd8 = local_38;
            }
            CImgIOException::CImgIOException
                      (pCVar7,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file \'%s\'."
                       ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,CONCAT44(uVar13,D),
                       CONCAT44(uVar14,C),csiz._4_4_,(uint)csiz,raw_14._data._4_4_,local_dd8);
            __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
          }
          if (D * C * csiz._4_4_ * (uint)csiz != 0) {
            CImg<double>::CImg((CImg<double> *)&img_14);
            ptrd_14 = (uchar *)(this->_data + raw_14._data._4_4_);
            if (iVar5 == 5) {
              pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
              uVar1 = this->_width;
              uVar2 = this->_allocated_width;
              pCVar3 = this->_data;
              pcVar6 = pixel_type();
              if (local_38 == (char *)0x0) {
                local_e00 = "(FILE*)";
              }
              else {
                local_e00 = local_38;
              }
              CImgIOException::CImgIOException
                        (pCVar7,
                         "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unable to load compressed data from file \'%s\' unless zlib is enabled."
                         ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,local_e00);
              __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
            }
            CImg<unsigned_char>::assign((CImg<unsigned_char> *)ptrd_14,D,C,csiz._4_4_,(uint)csiz);
            to_read_14 = *(unsigned_long *)(ptrd_14 + 0x18);
            for (ptrs_14 = (double *)CImg<unsigned_char>::size((CImg<unsigned_char> *)ptrd_14);
                ptrs_14 != (double *)0x0; ptrs_14 = (double *)((long)ptrs_14 - (ulong)(uint)img_14))
            {
              tVar8 = cimg::min<unsigned_long,unsigned_long>
                                ((unsigned_long *)&ptrs_14,(unsigned_long *)&nfile);
              CImg<double>::assign((CImg<double> *)&img_14,(uint)tVar8,1,1,1);
              cimg::fread<double>((double *)raw_14._16_8_,(ulong)(uint)img_14,(FILE *)local_5c8);
              bVar11 = cimg::endianness();
              uVar4 = raw_14._16_8_;
              if (tmp._data._6_1_ != bVar11) {
                uVar9 = CImg<double>::size((CImg<double> *)&img_14);
                cimg::invert_endianness<double>((double *)uVar4,uVar9);
              }
              off_14 = raw_14._16_8_;
              for (local_598 = (ulong)(uint)img_14; local_598 != 0; local_598 = local_598 - 1) {
                *(char *)to_read_14 = (char)(int)*(double *)off_14;
                off_14 = off_14 + 8;
                to_read_14 = to_read_14 + 1;
              }
            }
            CImg<double>::~CImg((CImg<double> *)&img_14);
          }
        }
        bVar11 = true;
      }
    }
    if (bVar11) {
      if (filename_local == (char *)0x0) {
        cimg::fclose(local_5c8);
      }
      CImg<char>::~CImg((CImg<char> *)&N);
      CImg<char>::~CImg((CImg<char> *)&str_endian._data);
      CImg<char>::~CImg((CImg<char> *)&str_pixeltype._data);
      return this;
    }
    if (filename_local == (char *)0x0) {
      cimg::fclose(local_5c8);
    }
    pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_allocated_width;
    pCVar3 = this->_data;
    pcVar6 = pixel_type();
    if (local_38 == (char *)0x0) {
      local_e50 = "(FILE*)";
    }
    else {
      local_e50 = local_38;
    }
    CImgIOException::CImgIOException
              (pCVar7,
               "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): Unsupported pixel type \'%s\' for file \'%s\'."
               ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,str_pixeltype._16_8_,local_e50);
    __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
  }
  if (filename_local == (char *)0x0) {
    cimg::fclose(local_5c8);
  }
  pCVar7 = (CImgIOException *)__cxa_allocate_exception(0x10);
  uVar1 = this->_width;
  uVar2 = this->_allocated_width;
  pCVar3 = this->_data;
  pcVar6 = pixel_type();
  if (local_38 == (char *)0x0) {
    local_600 = "(FILE*)";
  }
  else {
    local_600 = local_38;
  }
  CImgIOException::CImgIOException
            (pCVar7,
             "[instance(%u,%u,%p)] CImgList<%s>::load_cimg(): CImg header not found in file \'%s\'."
             ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar6,local_600);
  __cxa_throw(pCVar7,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
}

Assistant:

CImgList<T>& _load_cimg(std::FILE *const file, const char *const filename) {
#ifdef cimg_use_zlib
#define _cimgz_load_cimg_case(Tss) { \
   Bytef *const cbuf = new Bytef[csiz]; \
   cimg::fread(cbuf,csiz,nfile); \
   raw.assign(W,H,D,C); \
   unsigned long destlen = (unsigned long)raw.size()*sizeof(Tss); \
   uncompress((Bytef*)raw._data,&destlen,cbuf,csiz); \
   delete[] cbuf; \
   if (endian!=cimg::endianness()) cimg::invert_endianness(raw._data,raw.size()); \
   raw.move_to(img); \
}
#else
#define _cimgz_load_cimg_case(Tss) \
   throw CImgIOException(_cimglist_instance \
                         "load_cimg(): Unable to load compressed data from file '%s' unless zlib is enabled.", \
                         cimglist_instance, \
                         filename?filename:"(FILE*)");
#endif

#define _cimg_load_cimg_case(Ts,Tss) \
      if (!loaded && !cimg::strcasecmp(Ts,str_pixeltype)) { \
        for (unsigned int l = 0; l<N; ++l) { \
          j = 0; while ((i=std::fgetc(nfile))!='\n' && i>=0 && j<255) tmp[j++] = (char)i; tmp[j] = 0; \
          W = H = D = C = 0; csiz = 0; \
          if ((err = cimg_sscanf(tmp,"%u %u %u %u #%lu",&W,&H,&D,&C,&csiz))<4) \
            throw CImgIOException(_cimglist_instance \
                                  "load_cimg(): Invalid specified size (%u,%u,%u,%u) of image %u in file '%s'.", \
                                  cimglist_instance, \
                                  W,H,D,C,l,filename?filename:("(FILE*)")); \
          if (W*H*D*C>0) { \
            CImg<Tss> raw; \
            CImg<T> &img = _data[l]; \
            if (err==5) _cimgz_load_cimg_case(Tss) \
            else { \
              img.assign(W,H,D,C); \
              T *ptrd = img._data; \
              for (unsigned long to_read = img.size(); to_read; ) { \
                raw.assign(cimg::min(to_read,cimg_iobuffer)); \
                cimg::fread(raw._data,raw._width,nfile); \
                if (endian!=cimg::endianness()) cimg::invert_endianness(raw._data,raw.size()); \
                const Tss *ptrs = raw._data; \
                for (unsigned long off = (unsigned long)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++); \
                to_read-=raw._width; \
              } \
            } \
          } \
        } \
        loaded = true; \
      }

      if (!filename && !file)
        throw CImgArgumentException(_cimglist_instance
                                    "load_cimg(): Specified filename is (null).",
                                    cimglist_instance);

      const unsigned long cimg_iobuffer = 24*1024*1024;
      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      bool loaded = false, endian = cimg::endianness();
      CImg<charT> tmp(256), str_pixeltype(256), str_endian(256);
      *tmp = *str_pixeltype = *str_endian = 0;
      unsigned int j, N = 0, W, H, D, C;
      unsigned long csiz;
      int i, err;
      do {
        j = 0; while ((i=std::fgetc(nfile))!='\n' && i>=0 && j<255) tmp[j++] = (char)i; tmp[j] = 0;
      } while (*tmp=='#' && i>=0);
      err = cimg_sscanf(tmp,"%u%*c%255[A-Za-z_]%*c%255[sA-Za-z_ ]",
                        &N,str_pixeltype._data,str_endian._data);
      if (err<2) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimglist_instance
                              "load_cimg(): CImg header not found in file '%s'.",
                              cimglist_instance,
                              filename?filename:"(FILE*)");
      }
      if (!cimg::strncasecmp("little",str_endian,6)) endian = false;
      else if (!cimg::strncasecmp("big",str_endian,3)) endian = true;
      assign(N);
      _cimg_load_cimg_case("bool",bool);
      _cimg_load_cimg_case("unsigned_char",unsigned char);
      _cimg_load_cimg_case("uchar",unsigned char);
      _cimg_load_cimg_case("char",char);
      _cimg_load_cimg_case("unsigned_short",unsigned short);
      _cimg_load_cimg_case("ushort",unsigned short);
      _cimg_load_cimg_case("short",short);
      _cimg_load_cimg_case("unsigned_int",unsigned int);
      _cimg_load_cimg_case("uint",unsigned int);
      _cimg_load_cimg_case("int",int);
      _cimg_load_cimg_case("unsigned_long",unsigned long);
      _cimg_load_cimg_case("ulong",unsigned long);
      _cimg_load_cimg_case("long",long);
      _cimg_load_cimg_case("float",float);
      _cimg_load_cimg_case("double",double);

      if (!loaded) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimglist_instance
                              "load_cimg(): Unsupported pixel type '%s' for file '%s'.",
                              cimglist_instance,
                              str_pixeltype._data,filename?filename:"(FILE*)");
      }
      if (!file) cimg::fclose(nfile);
      return *this;
    }